

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# palette.c
# Opt level: O0

int SearchColorNoIdx(uint32_t *sorted,uint32_t color,int num_colors)

{
  int iVar1;
  int mid;
  int hi;
  int low;
  int num_colors_local;
  uint32_t color_local;
  uint32_t *sorted_local;
  int local_4;
  
  low = 0;
  iVar1 = num_colors;
  if (*sorted == color) {
    local_4 = 0;
  }
  else {
    while (hi = iVar1, local_4 = low + hi >> 1, sorted[local_4] != color) {
      iVar1 = local_4;
      if (sorted[local_4] < color) {
        iVar1 = hi;
        low = local_4;
      }
    }
  }
  return local_4;
}

Assistant:

int SearchColorNoIdx(const uint32_t sorted[], uint32_t color, int num_colors) {
  int low = 0, hi = num_colors;
  if (sorted[low] == color) return low;  // loop invariant: sorted[low] != color
  while (1) {
    const int mid = (low + hi) >> 1;
    if (sorted[mid] == color) {
      return mid;
    } else if (sorted[mid] < color) {
      low = mid;
    } else {
      hi = mid;
    }
  }
  assert(0);
  return 0;
}